

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Individual.cpp
# Opt level: O0

Individual * __thiscall
Individual::makeOffspring(Individual *__return_storage_ptr__,Individual *this,Individual *mother)

{
  int iVar1;
  size_type sVar2;
  int *piVar3;
  reference pvVar4;
  int local_78;
  int randomnum;
  int i;
  int local_6c;
  int endToUseOtherIndividualIdx;
  int fromMotherCount;
  int fromFatherCount;
  int startToUseOtherIndividualIdx;
  int numerOfTaks;
  shared_ptr<Instance> local_50;
  undefined1 local_39;
  Individual *local_38;
  Individual *individuals [2];
  Individual *mother_local;
  Individual *this_local;
  Individual *offspring;
  
  local_39 = 0;
  local_38 = this;
  individuals[0] = mother;
  std::shared_ptr<Instance>::shared_ptr(&local_50,&this->usedInstance);
  Individual(__return_storage_ptr__,&local_50,0);
  std::shared_ptr<Instance>::~shared_ptr(&local_50);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->coresAsignedToTasks);
  fromFatherCount = (int)sVar2;
  iVar1 = rand();
  fromMotherCount = iVar1 % fromFatherCount;
  iVar1 = rand();
  endToUseOtherIndividualIdx = iVar1 % fromFatherCount;
  local_6c = fromFatherCount - endToUseOtherIndividualIdx;
  randomnum = fromMotherCount + endToUseOtherIndividualIdx;
  piVar3 = std::min<int>(&fromFatherCount,&randomnum);
  i = *piVar3;
  endToUseOtherIndividualIdx = i - fromMotherCount;
  for (local_78 = 0;
      sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->coresAsignedToTasks),
      (ulong)(long)local_78 < sVar2; local_78 = local_78 + 1) {
    iVar1 = rand();
    if (((iVar1 % 2 == 1) && (0 < endToUseOtherIndividualIdx)) || (local_6c == 0)) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::at(&this->coresAsignedToTasks,(long)local_78)
      ;
      std::vector<int,_std::allocator<int>_>::push_back
                (&__return_storage_ptr__->coresAsignedToTasks,pvVar4);
      endToUseOtherIndividualIdx = endToUseOtherIndividualIdx + -1;
    }
    else {
      pvVar4 = std::vector<int,_std::allocator<int>_>::at
                         (&mother->coresAsignedToTasks,(long)local_78);
      std::vector<int,_std::allocator<int>_>::push_back
                (&__return_storage_ptr__->coresAsignedToTasks,pvVar4);
      local_6c = local_6c + -1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Individual Individual::makeOffspring(Individual& mother){
	Individual* individuals[2] = {this, &mother};
	Individual offspring(this->usedInstance);

	int numerOfTaks = coresAsignedToTasks.size();
	int startToUseOtherIndividualIdx = rand()%numerOfTaks;
	int fromFatherCount = rand()%numerOfTaks;
	int fromMotherCount=numerOfTaks-fromFatherCount;
	int endToUseOtherIndividualIdx = min(numerOfTaks, startToUseOtherIndividualIdx + fromFatherCount);
	fromFatherCount = endToUseOtherIndividualIdx - startToUseOtherIndividualIdx;


	for(int i = 0; i < coresAsignedToTasks.size(); i++){
		int randomnum=rand()%2;
		if((randomnum==1 && fromFatherCount>0)||fromMotherCount==0){
			offspring.coresAsignedToTasks.push_back( this->coresAsignedToTasks.at(i) );
			fromFatherCount--;
		}
		else{
			offspring.coresAsignedToTasks.push_back( mother.coresAsignedToTasks.at(i) );
			fromMotherCount--;
		}
	}

	return offspring;
}